

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token __thiscall slang::syntax::SyntaxNode::getFirstToken(SyntaxNode *this)

{
  bool bVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  Token local_58;
  undefined1 local_48 [8];
  ConstTokenOrSyntax child;
  size_t i;
  size_t childCount;
  SyntaxNode *this_local;
  Token result;
  
  sVar2 = getChildCount(this);
  child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_index =
       '\0';
  child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._17_7_ = 0;
  do {
    if (sVar2 <= (ulong)child.
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        ._16_8_) {
      parsing::Token::Token((Token *)&this_local);
      return _this_local;
    }
    getChild((ConstTokenOrSyntax *)local_48,this,
             child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             _16_8_);
    bVar1 = ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)local_48);
    if (bVar1) {
      local_58 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)local_48);
      bVar1 = parsing::Token::operator_cast_to_bool(&local_58);
      if (bVar1) {
        TVar4 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)local_48);
        return TVar4;
      }
    }
    else {
      pSVar3 = ConstTokenOrSyntax::node((ConstTokenOrSyntax *)local_48);
      if (pSVar3 != (SyntaxNode *)0x0) {
        pSVar3 = ConstTokenOrSyntax::node((ConstTokenOrSyntax *)local_48);
        _this_local = getFirstToken(pSVar3);
        bVar1 = parsing::Token::operator_cast_to_bool((Token *)&this_local);
        if (bVar1) {
          return _this_local;
        }
      }
    }
    child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._16_8_ =
         child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         _16_8_ + 1;
  } while( true );
}

Assistant:

parsing::Token SyntaxNode::getFirstToken() const {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChild(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstToken();
            if (result)
                return result;
        }
    }
    return Token();
}